

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O0

int Field_Editing(_func_int_FORM_ptr *fct,FORM *form)

{
  int local_1c;
  int res;
  FORM *form_local;
  _func_int_FORM_ptr *fct_local;
  
  local_1c = -0xc;
  if ((((fct == FE_Delete_Previous) && ((form->opts & 2U) != 0)) && (form->currow == 0)) &&
     (form->curcol == 0)) {
    local_1c = Inter_Field_Navigation(FN_Previous_Field,form);
  }
  else if (fct == FE_New_Line) {
    if ((((form->opts & 1U) == 0) || (form->currow != 0)) || (form->curcol != 0)) {
      local_1c = FE_New_Line(form);
    }
    else {
      local_1c = Inter_Field_Navigation(FN_Next_Field,form);
    }
  }
  else if (((form->current->opts & 8U) != 0) && (local_1c = (*fct)(form), local_1c == 0)) {
    form->status = form->status | 0x10;
  }
  return local_1c;
}

Assistant:

static int Field_Editing(int (* const fct) (FORM *), FORM * form)
{
  int res = E_REQUEST_DENIED;

  /* We have to deal here with the specific case of the overloaded 
     behaviour of New_Line and Delete_Previous requests.
     They may end up in navigational requests if we are on the first
     character in a field. But navigation is also allowed on non-
     editable fields.
  */ 
  if ((fct==FE_Delete_Previous)            && 
      (form->opts & O_BS_OVERLOAD)         &&
      First_Position_In_Current_Field(form) )
    {
      res = Inter_Field_Navigation(FN_Previous_Field,form);
    }
  else
    {
      if (fct==FE_New_Line)
        {
          if ((form->opts & O_NL_OVERLOAD)         &&
              First_Position_In_Current_Field(form))
            {
              res = Inter_Field_Navigation(FN_Next_Field,form);
            }
          else
            /* FE_New_Line deals itself with the _WINDOW_MODIFIED flag */
            res = fct(form);
        }
      else
        {
          /* From now on, everything must be editable */
          if (form->current->opts & O_EDIT)
            {
              res = fct(form);
              if (res==E_OK)
                form->status |= _WINDOW_MODIFIED;
            }
        }
    }
  return res;
}